

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O1

void keypoint_approach(Mat *image_model,Mat *image_test)

{
  pointer pKVar1;
  void *pvVar2;
  bool bVar3;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_test;
  _InputArray *keypoint_model;
  long *local_358;
  undefined8 uStack_350;
  long local_348 [2];
  _InputArray local_338;
  undefined8 uStack_320;
  undefined1 local_310 [24];
  Mat local_2f8 [96];
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  knn_matches;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> filtered_matches;
  Ptr<cv::DescriptorMatcher> matcher;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_260;
  void *local_258;
  undefined8 uStack_250;
  long local_248;
  _InputArray local_240;
  Mat img_keypoint_test;
  Mat img_keypoint_model;
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> local_168;
  _InputOutputArray local_f0;
  _InputArray local_d8;
  ORB_Param test_param;
  ORB_Param param_model;
  Mat img_keypoint_matches;
  
  pKVar1 = (pointer)(local_310 + 0x10);
  local_310._0_8_ = pKVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"pretreat model","");
  cv::namedWindow((string *)local_310,0);
  if ((pointer)local_310._0_8_ != pKVar1) {
    operator_delete((void *)local_310._0_8_,(ulong)((long)&((Point2f *)local_310._16_8_)->x + 1));
  }
  local_310._0_8_ = pKVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"pretreat model","");
  local_168.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  local_168.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)image_model;
  cv::imshow((string *)local_310,(_InputArray *)&local_168);
  if ((pointer)local_310._0_8_ != pKVar1) {
    operator_delete((void *)local_310._0_8_,(ulong)((long)&((Point2f *)local_310._16_8_)->x + 1));
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  local_310._0_8_ = pKVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"pretreat test","");
  cv::namedWindow((string *)local_310,0);
  if ((pointer)local_310._0_8_ != pKVar1) {
    operator_delete((void *)local_310._0_8_,(ulong)((long)&((Point2f *)local_310._16_8_)->x + 1));
  }
  local_310._0_8_ = pKVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"pretreat test","");
  local_168.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  local_168.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)image_test;
  cv::imshow((string *)local_310,(_InputArray *)&local_168);
  if ((pointer)local_310._0_8_ != pKVar1) {
    operator_delete((void *)local_310._0_8_,(ulong)((long)&((Point2f *)local_310._16_8_)->x + 1));
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  param_model.edgeThreshold = 0x1f;
  param_model.fastThreshold = 0x14;
  param_model.patchSize = 0x1f;
  param_model.WTA_K = 2;
  param_model.nfeature = 10000;
  param_model.nlevels = 8;
  test_param.patchSize = 0x1f;
  test_param.WTA_K = 4;
  test_param.nfeature = 10000;
  test_param.nlevels = 8;
  test_param.edgeThreshold = 100;
  test_param.fastThreshold = 0x14;
  keypoint_compute((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
                   local_310,image_model,&param_model);
  keypoint_compute(&local_168,image_test,&test_param);
  _img_keypoint_model = 4;
  cv::DescriptorMatcher::create((MatcherType *)&matcher);
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _img_keypoint_model = 0x1010000;
  _img_keypoint_test = 0x1010000;
  bVar3 = (bool)cv::noArray();
  keypoint_model = (_InputArray *)&img_keypoint_model;
  cv::DescriptorMatcher::knnMatch
            (_matcher,(_InputArray *)&img_keypoint_model,(vector *)&img_keypoint_test,
             (int)&knn_matches,(_InputArray *)0x2,bVar3);
  filter_match(&filtered_matches,
               (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)keypoint_model,keypoint_test,
               &knn_matches,0.75);
  cv::Mat::Mat(&img_keypoint_model);
  cv::Mat::Mat(&img_keypoint_test);
  cv::Mat::Mat(&img_keypoint_matches);
  local_338.sz.width = 0;
  local_338.sz.height = 0;
  local_338.flags = 0x1010000;
  local_240.sz.width = 0;
  local_240.sz.height = 0;
  local_240.flags = 0x3010000;
  local_358 = (long *)0x0;
  local_348[0] = 0;
  local_348[1] = 0;
  uStack_350 = 0x406fe00000000000;
  local_338.obj = image_model;
  local_240.obj = (_InputArray *)&img_keypoint_model;
  cv::drawKeypoints(&local_338,(vector *)local_310,(_InputOutputArray *)&local_240,
                    (Scalar_ *)&local_358,DEFAULT);
  local_338.sz.width = 0;
  local_338.sz.height = 0;
  local_338.flags = 0x1010000;
  local_240.sz.width = 0;
  local_240.sz.height = 0;
  local_240.flags = 0x3010000;
  local_358 = (long *)0x0;
  local_348[0] = 0;
  local_348[1] = 0;
  uStack_350 = 0x406fe00000000000;
  local_338.obj = image_test;
  local_240.obj = &img_keypoint_test;
  cv::drawKeypoints(&local_338,(vector *)&local_168,(_InputOutputArray *)&local_240,
                    (Scalar_ *)&local_358,DEFAULT);
  local_240.sz.width = 0;
  local_240.sz.height = 0;
  local_240.flags = 0x1010000;
  local_d8.sz.width = 0;
  local_d8.sz.height = 0;
  local_d8.flags = 0x1010000;
  local_f0.super__OutputArray.super__InputArray.sz.width = 0;
  local_f0.super__OutputArray.super__InputArray.sz.height = 0;
  local_f0.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_358 = (long *)0xbff0000000000000;
  uStack_350 = 0xbff0000000000000;
  local_348[0] = -0x4010000000000000;
  local_348[1] = 0xbff0000000000000;
  local_338.flags = 0;
  local_338._4_4_ = 0xbff00000;
  local_338.obj = (void *)0xbff0000000000000;
  local_338.sz.width = 0;
  local_338.sz.height = -0x40100000;
  uStack_320 = 0xbff0000000000000;
  local_248 = 0;
  local_258 = (void *)0x0;
  uStack_250 = 0;
  local_240.obj = image_model;
  local_f0.super__OutputArray.super__InputArray.obj = &img_keypoint_matches;
  local_d8.obj = image_test;
  cv::drawMatches(&local_240,(vector *)local_310,&local_d8,(vector *)&local_168,
                  (vector *)&filtered_matches,&local_f0,(Scalar_ *)&local_358,(Scalar_ *)&local_338,
                  (vector *)&local_258,DEFAULT);
  if (local_258 != (void *)0x0) {
    operator_delete(local_258,local_248 - (long)local_258);
  }
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Keypoint model","");
  cv::namedWindow((string *)&local_358,0);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Keypoint model","");
  local_338.sz.width = 0;
  local_338.sz.height = 0;
  local_338.flags = 0x1010000;
  local_338.obj = &img_keypoint_model;
  cv::imshow((string *)&local_358,&local_338);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Keypoint test","");
  cv::namedWindow((string *)&local_358,0);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Keypoint test","");
  local_338.sz.width = 0;
  local_338.sz.height = 0;
  local_338.flags = 0x1010000;
  local_338.obj = &img_keypoint_test;
  cv::imshow((string *)&local_358,&local_338);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Keypoint matches","");
  cv::namedWindow((string *)&local_358,0);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Keypoint matches","");
  local_338.sz.width = 0;
  local_338.sz.height = 0;
  local_338.flags = 0x1010000;
  local_338.obj = &img_keypoint_matches;
  cv::imshow((string *)&local_358,&local_338);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  cv::Mat::~Mat(&img_keypoint_matches);
  cv::Mat::~Mat(&img_keypoint_test);
  cv::Mat::~Mat(&img_keypoint_model);
  if (filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)filtered_matches.
                          super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)filtered_matches.
                          super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ::~vector(&knn_matches);
  if (local_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260);
  }
  cv::Mat::~Mat(&local_168.second);
  pvVar2 = (void *)CONCAT44(local_168.first.
                            super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_168.first.
                            super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_168.first.
                                 super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  cv::Mat::~Mat(local_2f8);
  if ((pointer)local_310._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_310._0_8_,local_310._16_8_ - local_310._0_8_);
  }
  return;
}

Assistant:

void keypoint_approach(const cv::Mat& image_model, const cv::Mat& image_test)
{
    cv::namedWindow("pretreat model", cv::WINDOW_NORMAL);
    cv::imshow("pretreat model", image_model);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("pretreat test", cv::WINDOW_NORMAL);
    cv::imshow("pretreat test", image_test);
    cv::waitKey(0);
    cv::destroyAllWindows();

    ORB_Param param_model, test_param;
    param_model.nfeature = 10000;

    test_param.nfeature = 10000;
    // test_param.nlevels = 16;
    test_param.WTA_K = 4;
    test_param.edgeThreshold = 100;

    auto [keypoint_model, descriptor_model] = keypoint_compute(image_model, param_model);
    auto [keypoint_test, descriptor_test] = keypoint_compute(image_test, test_param);

#if CV_MAJOR_VERSION < 3
    auto matcher = cv::DescriptorMatcher::create("NORM_HAMMING");
#else
    auto matcher = cv::DescriptorMatcher::create(cv::DescriptorMatcher::BRUTEFORCE_HAMMING);
#endif

    std::vector<std::vector<cv::DMatch>> knn_matches;
    matcher->knnMatch(descriptor_model, descriptor_test, knn_matches, 2);

    const float ratio_thresh = 0.75f;
    std::vector<cv::DMatch> filtered_matches = filter_match(keypoint_model, keypoint_test, knn_matches, ratio_thresh);

    cv::Mat img_keypoint_model, img_keypoint_test, img_keypoint_matches;

    cv::drawKeypoints(image_model, keypoint_model, img_keypoint_model, cv::Scalar(0, 255, 0));
    cv::drawKeypoints(image_test, keypoint_test, img_keypoint_test, cv::Scalar(0, 255, 0));
    cv::drawMatches(image_model, keypoint_model, image_test, keypoint_test, filtered_matches, img_keypoint_matches);

    cv::namedWindow("Keypoint model", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint model", img_keypoint_model);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("Keypoint test", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint test", img_keypoint_test);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("Keypoint matches", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint matches", img_keypoint_matches);
    cv::waitKey(0);
    cv::destroyAllWindows();
}